

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

double __thiscall cppforth::Forth::ForthStack<double>::getTop(ForthStack<double> *this,size_t index)

{
  reference pvVar1;
  AbortException *this_00;
  size_type __n;
  
  __n = this->top - index;
  if (__n < (ulong)((long)(this->stack).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->stack).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(&this->stack,__n);
    return *pvVar1;
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  AbortException::AbortException(this_00,"Forth stack overflow");
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CellType getTop(size_t index){
				{auto index1 = top - index;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				return stack.at(top - index);
			}